

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cpp
# Opt level: O1

bool fs_remove(string_view path)

{
  string_view path_00;
  int iVar1;
  char cVar2;
  char *in_RSI;
  size_t in_RDI;
  string_view fname;
  error_code ec;
  error_code local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  path local_40;
  
  local_60._M_value = 0;
  local_50._M_len = in_RDI;
  local_50._M_str = in_RSI;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&local_50,auto_format);
  cVar2 = std::filesystem::remove(&local_40,&local_60);
  iVar1 = local_60._M_value;
  if (cVar2 == '\0') {
    std::filesystem::__cxx11::path::~path(&local_40);
  }
  else {
    std::filesystem::__cxx11::path::~path(&local_40);
    if (iVar1 == 0) {
      return true;
    }
  }
  path_00._M_str = local_50._M_str;
  path_00._M_len = local_50._M_len;
  fname._M_str = "fs_remove";
  fname._M_len = 9;
  fs_print_error(path_00,fname,&local_60);
  return false;
}

Assistant:

bool
fs_remove(std::string_view path)
{
  // remove a file or empty directory
  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  // https://en.cppreference.com/w/cpp/filesystem/remove
  if(std::filesystem::remove(path, ec) && !ec) FFS_LIKELY
    return true;
#else
  // https://en.cppreference.com/w/cpp/io/c/remove
  if(std::remove(path.data()) == 0)
    return true;

#ifdef _WIN32
  // https://docs.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-deletefilea
  // may need these when deleting a symlink
  // https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-createsymboliclinka#remarks

  if(fs_is_file(path)){
    if(DeleteFileA(path.data()) != 0)
      return true;
  } else if(fs_is_dir(path)){
    if(RemoveDirectoryA(path.data()) != 0)
      return true;
  }

#endif

#endif

  fs_print_error(path, __func__, ec);
  return false;
}